

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camellia.c
# Opt level: O1

int mbedtls_camellia_self_test(int verbose)

{
  int iVar1;
  uchar (*pauVar2) [16];
  uchar *puVar3;
  uchar (*pauVar4) [48];
  char *pcVar5;
  ulong uVar6;
  size_t __n;
  uint uVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  uchar src [16];
  size_t offset;
  uchar key [32];
  uchar nonce_counter [16];
  uchar iv [16];
  uchar buf [64];
  uchar stream_block [16];
  mbedtls_camellia_context ctx;
  uchar local_218 [32];
  size_t local_1f8;
  uchar (*local_1f0) [2] [16];
  uchar (*local_1e8) [2] [16];
  size_t local_1e0;
  uchar local_1d8 [16];
  undefined1 local_1c8 [16];
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  uchar local_1a8 [8];
  uchar auStack_1a0 [8];
  uchar local_198;
  uchar uStack_197;
  uchar uStack_196;
  uchar uStack_195;
  uchar uStack_194;
  uchar uStack_193;
  uchar uStack_192;
  uchar uStack_191;
  uchar uStack_190;
  uchar uStack_18f;
  uchar uStack_18e;
  uchar uStack_18d;
  uchar uStack_18c;
  uchar uStack_18b;
  uchar uStack_18a;
  uchar uStack_189;
  uchar local_158 [20];
  mbedtls_camellia_context local_144;
  
  local_1d8[0] = '\0';
  local_1d8[1] = '\0';
  local_1d8[2] = '\0';
  local_1d8[3] = '\0';
  local_1d8[4] = '\0';
  local_1d8[5] = '\0';
  local_1d8[6] = '\0';
  local_1d8[7] = '\0';
  local_1d8[8] = '\0';
  local_1d8[9] = '\0';
  local_1d8[10] = '\0';
  local_1d8[0xb] = '\0';
  local_1d8[0xc] = '\0';
  local_1d8[0xd] = '\0';
  local_1d8[0xe] = '\0';
  local_1d8[0xf] = '\0';
  local_1c8 = (undefined1  [16])0x0;
  uVar10 = 0;
  do {
    uVar6 = uVar10 >> 1 & 0x7fffffff;
    iVar1 = (int)uVar6;
    if (verbose != 0) {
      pcVar5 = "enc";
      if ((uVar10 & 1) == 0) {
        pcVar5 = "dec";
      }
      printf("  CAMELLIA-ECB-%3d (%s): ",(ulong)(iVar1 * 0x40 + 0x80),pcVar5);
    }
    local_1e8 = camellia_test_ecb_cipher + (uVar10 >> 1);
    local_1e0 = (size_t)(iVar1 * 8 + 0x10);
    uVar7 = iVar1 * 0x40 + 0x80;
    local_1f0 = camellia_test_ecb_cipher + uVar6;
    lVar9 = 0;
    lVar8 = 0;
    do {
      puVar3 = local_1d8;
      memcpy(puVar3,camellia_test_ecb_key[uVar10 >> 1][0] + lVar9 * 2,local_1e0);
      if ((uVar10 & 1) == 0) {
        mbedtls_camellia_setkey_dec(&local_144,puVar3,uVar7);
        iVar1 = (int)puVar3;
        puVar3 = (*local_1e8)[0] + lVar9;
        local_218._0_8_ = *(undefined8 *)puVar3;
        local_218._8_8_ = *(undefined8 *)(puVar3 + 8);
        pauVar2 = (uchar (*) [16])(camellia_test_ecb_plain[0] + lVar9);
      }
      else {
        mbedtls_camellia_setkey_enc(&local_144,puVar3,uVar7);
        iVar1 = (int)puVar3;
        local_218._0_8_ = *(undefined8 *)(camellia_test_ecb_plain[0] + lVar9);
        local_218._8_8_ = *(undefined8 *)(camellia_test_ecb_plain[0] + lVar9 + 8);
        pauVar2 = *local_1f0 + lVar8;
      }
      local_218._16_8_ = *(undefined8 *)*pauVar2;
      local_218._24_8_ = *(undefined8 *)(*pauVar2 + 8);
      mbedtls_camellia_crypt_ecb(&local_144,iVar1,local_218,&local_198);
      auVar11[0] = -(local_198 == local_218[0x10]);
      auVar11[1] = -(uStack_197 == local_218[0x11]);
      auVar11[2] = -(uStack_196 == local_218[0x12]);
      auVar11[3] = -(uStack_195 == local_218[0x13]);
      auVar11[4] = -(uStack_194 == local_218[0x14]);
      auVar11[5] = -(uStack_193 == local_218[0x15]);
      auVar11[6] = -(uStack_192 == local_218[0x16]);
      auVar11[7] = -(uStack_191 == local_218[0x17]);
      auVar11[8] = -(uStack_190 == local_218[0x18]);
      auVar11[9] = -(uStack_18f == local_218[0x19]);
      auVar11[10] = -(uStack_18e == local_218[0x1a]);
      auVar11[0xb] = -(uStack_18d == local_218[0x1b]);
      auVar11[0xc] = -(uStack_18c == local_218[0x1c]);
      auVar11[0xd] = -(uStack_18b == local_218[0x1d]);
      auVar11[0xe] = -(uStack_18a == local_218[0x1e]);
      auVar11[0xf] = -(uStack_189 == local_218[0x1f]);
      if ((ushort)((ushort)(SUB161(auVar11 >> 7,0) & 1) |
                   (ushort)(SUB161(auVar11 >> 0xf,0) & 1) << 1 |
                   (ushort)(SUB161(auVar11 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar11 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar11 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar11 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar11 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar11 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar11 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar11 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar11 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar11 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar11 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar11 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar11 >> 0x77,0) & 1) << 0xe |
                  (ushort)(auVar11[0xf] >> 7) << 0xf) != 0xffff) goto LAB_00169b99;
      lVar8 = lVar8 + 1;
      lVar9 = lVar9 + 0x10;
    } while (lVar9 == 0x10);
    if (verbose != 0) {
      puts("passed");
    }
    uVar10 = uVar10 + 1;
  } while ((int)uVar10 != 6);
  if (verbose != 0) {
    putchar(10);
  }
  uVar10 = 0;
  do {
    uVar6 = uVar10 >> 1 & 0x7fffffff;
    iVar1 = (int)uVar6;
    if (verbose != 0) {
      pcVar5 = "enc";
      if ((uVar10 & 1) == 0) {
        pcVar5 = "dec";
      }
      printf("  CAMELLIA-CBC-%3d (%s): ",(ulong)(iVar1 * 0x40 + 0x80),pcVar5);
    }
    local_218[0] = '\0';
    local_218[1] = '\x01';
    local_218[2] = '\x02';
    local_218[3] = '\x03';
    local_218[4] = '\x04';
    local_218[5] = '\x05';
    local_218[6] = '\x06';
    local_218[7] = '\a';
    local_218[8] = '\b';
    local_218[9] = '\t';
    local_218[10] = '\n';
    local_218[0xb] = '\v';
    local_218[0xc] = '\f';
    local_218[0xd] = '\r';
    local_218[0xe] = '\x0e';
    local_218[0xf] = '\x0f';
    local_218[0x10] = '\0';
    local_218[0x11] = '\x01';
    local_218[0x12] = '\x02';
    local_218[0x13] = '\x03';
    local_218[0x14] = '\x04';
    local_218[0x15] = '\x05';
    local_218[0x16] = '\x06';
    local_218[0x17] = '\a';
    local_218[0x18] = '\b';
    local_218[0x19] = '\t';
    local_218[0x1a] = '\n';
    local_218[0x1b] = '\v';
    local_218[0x1c] = '\f';
    local_218[0x1d] = '\r';
    local_218[0x1e] = '\x0e';
    local_218[0x1f] = '\x0f';
    memcpy(local_1d8,camellia_test_cbc_key + uVar6,(ulong)(iVar1 * 8 + 0x10));
    uVar7 = iVar1 * 0x40 + 0x80;
    if ((uVar10 & 1) == 0) {
      mbedtls_camellia_setkey_dec(&local_144,local_1d8,uVar7);
    }
    else {
      mbedtls_camellia_setkey_enc(&local_144,local_1d8,uVar7);
    }
    lVar9 = 0;
    lVar8 = 0;
    do {
      if ((uVar10 & 1) == 0) {
        local_1a8[0] = local_218[0];
        local_1a8[1] = local_218[1];
        local_1a8[2] = local_218[2];
        local_1a8[3] = local_218[3];
        local_1a8[4] = local_218[4];
        local_1a8[5] = local_218[5];
        local_1a8[6] = local_218[6];
        local_1a8[7] = local_218[7];
        auStack_1a0[0] = local_218[8];
        auStack_1a0[1] = local_218[9];
        auStack_1a0[2] = local_218[10];
        auStack_1a0[3] = local_218[0xb];
        auStack_1a0[4] = local_218[0xc];
        auStack_1a0[5] = local_218[0xd];
        auStack_1a0[6] = local_218[0xe];
        auStack_1a0[7] = local_218[0xf];
        puVar3 = camellia_test_cbc_cipher[uVar10 >> 1][0] + lVar9;
        local_218._0_8_ = *(undefined8 *)puVar3;
        local_218._8_8_ = *(undefined8 *)(puVar3 + 8);
        puVar3 = camellia_test_cbc_plain[lVar8];
      }
      else {
        local_1a8[0] = local_218[0x10];
        local_1a8[1] = local_218[0x11];
        local_1a8[2] = local_218[0x12];
        local_1a8[3] = local_218[0x13];
        local_1a8[4] = local_218[0x14];
        local_1a8[5] = local_218[0x15];
        local_1a8[6] = local_218[0x16];
        local_1a8[7] = local_218[0x17];
        auStack_1a0[0] = local_218[0x18];
        auStack_1a0[1] = local_218[0x19];
        auStack_1a0[2] = local_218[0x1a];
        auStack_1a0[3] = local_218[0x1b];
        auStack_1a0[4] = local_218[0x1c];
        auStack_1a0[5] = local_218[0x1d];
        auStack_1a0[6] = local_218[0x1e];
        auStack_1a0[7] = local_218[0x1f];
        local_218._0_8_ = *(undefined8 *)(camellia_test_cbc_plain[0] + lVar9);
        local_218._8_8_ = *(undefined8 *)(camellia_test_cbc_plain[0] + lVar9 + 8);
        puVar3 = camellia_test_cbc_cipher[uVar10 >> 1][0] + lVar9;
      }
      local_218._16_8_ = *(undefined8 *)puVar3;
      local_218._24_8_ = *(undefined8 *)(puVar3 + 8);
      mbedtls_camellia_crypt_cbc(&local_144,(uint)uVar10 & 1,0x10,local_1a8,local_218,&local_198);
      auVar12[0] = -(local_198 == local_218[0x10]);
      auVar12[1] = -(uStack_197 == local_218[0x11]);
      auVar12[2] = -(uStack_196 == local_218[0x12]);
      auVar12[3] = -(uStack_195 == local_218[0x13]);
      auVar12[4] = -(uStack_194 == local_218[0x14]);
      auVar12[5] = -(uStack_193 == local_218[0x15]);
      auVar12[6] = -(uStack_192 == local_218[0x16]);
      auVar12[7] = -(uStack_191 == local_218[0x17]);
      auVar12[8] = -(uStack_190 == local_218[0x18]);
      auVar12[9] = -(uStack_18f == local_218[0x19]);
      auVar12[10] = -(uStack_18e == local_218[0x1a]);
      auVar12[0xb] = -(uStack_18d == local_218[0x1b]);
      auVar12[0xc] = -(uStack_18c == local_218[0x1c]);
      auVar12[0xd] = -(uStack_18b == local_218[0x1d]);
      auVar12[0xe] = -(uStack_18a == local_218[0x1e]);
      auVar12[0xf] = -(uStack_189 == local_218[0x1f]);
      if ((ushort)((ushort)(SUB161(auVar12 >> 7,0) & 1) |
                   (ushort)(SUB161(auVar12 >> 0xf,0) & 1) << 1 |
                   (ushort)(SUB161(auVar12 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar12 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar12 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar12 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar12 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar12 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar12 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar12 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar12 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar12 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar12 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar12 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar12 >> 0x77,0) & 1) << 0xe |
                  (ushort)(auVar12[0xf] >> 7) << 0xf) != 0xffff) goto LAB_00169b99;
      lVar8 = lVar8 + 1;
      lVar9 = lVar9 + 0x10;
    } while (lVar9 != 0x30);
    if (verbose != 0) {
      puts("passed");
    }
    uVar10 = uVar10 + 1;
  } while ((int)uVar10 != 6);
  if (verbose != 0) {
    putchar(10);
  }
  uVar10 = 0;
  while( true ) {
    if (verbose != 0) {
      pcVar5 = "enc";
      if ((uVar10 & 1) == 0) {
        pcVar5 = "dec";
      }
      printf("  CAMELLIA-CTR-128 (%s): ",pcVar5);
    }
    uVar6 = uVar10 >> 1;
    local_1b8 = *(undefined8 *)camellia_test_ctr_nonce_counter[uVar6];
    uStack_1b0 = *(undefined8 *)(camellia_test_ctr_nonce_counter[uVar6] + 8);
    local_1d8 = camellia_test_ctr_key[uVar6];
    local_1f8 = 0;
    mbedtls_camellia_setkey_enc(&local_144,local_1d8,0x80);
    __n = (size_t)camellia_test_ctr_len[uVar6];
    if ((uVar10 & 1) == 0) {
      memcpy(&local_198,camellia_test_ctr_ct + uVar6,__n);
      mbedtls_camellia_crypt_ctr
                (&local_144,__n,&local_1f8,(uchar *)&local_1b8,local_158,&local_198,&local_198);
      pauVar4 = camellia_test_ctr_pt;
    }
    else {
      memcpy(&local_198,camellia_test_ctr_pt + uVar6,__n);
      mbedtls_camellia_crypt_ctr
                (&local_144,__n,&local_1f8,(uchar *)&local_1b8,local_158,&local_198,&local_198);
      pauVar4 = camellia_test_ctr_ct;
    }
    iVar1 = bcmp(&local_198,pauVar4 + uVar6,__n);
    if (iVar1 != 0) break;
    if (verbose != 0) {
      puts("passed");
    }
    uVar7 = (int)uVar10 + 1;
    uVar10 = (ulong)uVar7;
    if (uVar7 == 6) {
      if (verbose != 0) {
        putchar(10);
      }
      return 0;
    }
  }
LAB_00169b99:
  if (verbose == 0) {
    return 1;
  }
  puts("failed");
  return 1;
}

Assistant:

int mbedtls_camellia_self_test( int verbose )
{
    int i, j, u, v;
    unsigned char key[32];
    unsigned char buf[64];
    unsigned char src[16];
    unsigned char dst[16];
#if defined(MBEDTLS_CIPHER_MODE_CBC)
    unsigned char iv[16];
#endif
#if defined(MBEDTLS_CIPHER_MODE_CTR)
    size_t offset, len;
    unsigned char nonce_counter[16];
    unsigned char stream_block[16];
#endif

    mbedtls_camellia_context ctx;

    memset( key, 0, 32 );

    for( j = 0; j < 6; j++ ) {
        u = j >> 1;
    v = j & 1;

    if( verbose != 0 )
        mbedtls_printf( "  CAMELLIA-ECB-%3d (%s): ", 128 + u * 64,
                         (v == MBEDTLS_CAMELLIA_DECRYPT) ? "dec" : "enc");

    for( i = 0; i < CAMELLIA_TESTS_ECB; i++ ) {
        memcpy( key, camellia_test_ecb_key[u][i], 16 + 8 * u );

        if( v == MBEDTLS_CAMELLIA_DECRYPT ) {
            mbedtls_camellia_setkey_dec( &ctx, key, 128 + u * 64 );
            memcpy( src, camellia_test_ecb_cipher[u][i], 16 );
            memcpy( dst, camellia_test_ecb_plain[i], 16 );
        } else { /* MBEDTLS_CAMELLIA_ENCRYPT */
            mbedtls_camellia_setkey_enc( &ctx, key, 128 + u * 64 );
            memcpy( src, camellia_test_ecb_plain[i], 16 );
            memcpy( dst, camellia_test_ecb_cipher[u][i], 16 );
        }

        mbedtls_camellia_crypt_ecb( &ctx, v, src, buf );

        if( memcmp( buf, dst, 16 ) != 0 )
        {
            if( verbose != 0 )
                mbedtls_printf( "failed\n" );

            return( 1 );
        }
    }

    if( verbose != 0 )
        mbedtls_printf( "passed\n" );
    }

    if( verbose != 0 )
        mbedtls_printf( "\n" );

#if defined(MBEDTLS_CIPHER_MODE_CBC)
    /*
     * CBC mode
     */
    for( j = 0; j < 6; j++ )
    {
        u = j >> 1;
        v = j  & 1;

        if( verbose != 0 )
            mbedtls_printf( "  CAMELLIA-CBC-%3d (%s): ", 128 + u * 64,
                             ( v == MBEDTLS_CAMELLIA_DECRYPT ) ? "dec" : "enc" );

    memcpy( src, camellia_test_cbc_iv, 16 );
    memcpy( dst, camellia_test_cbc_iv, 16 );
    memcpy( key, camellia_test_cbc_key[u], 16 + 8 * u );

    if( v == MBEDTLS_CAMELLIA_DECRYPT ) {
        mbedtls_camellia_setkey_dec( &ctx, key, 128 + u * 64 );
    } else {
        mbedtls_camellia_setkey_enc( &ctx, key, 128 + u * 64 );
    }

    for( i = 0; i < CAMELLIA_TESTS_CBC; i++ ) {

        if( v == MBEDTLS_CAMELLIA_DECRYPT ) {
            memcpy( iv , src, 16 );
            memcpy( src, camellia_test_cbc_cipher[u][i], 16 );
            memcpy( dst, camellia_test_cbc_plain[i], 16 );
        } else { /* MBEDTLS_CAMELLIA_ENCRYPT */
            memcpy( iv , dst, 16 );
            memcpy( src, camellia_test_cbc_plain[i], 16 );
            memcpy( dst, camellia_test_cbc_cipher[u][i], 16 );
        }

        mbedtls_camellia_crypt_cbc( &ctx, v, 16, iv, src, buf );

        if( memcmp( buf, dst, 16 ) != 0 )
        {
            if( verbose != 0 )
                mbedtls_printf( "failed\n" );

            return( 1 );
        }
    }

        if( verbose != 0 )
            mbedtls_printf( "passed\n" );
    }
#endif /* MBEDTLS_CIPHER_MODE_CBC */

    if( verbose != 0 )
        mbedtls_printf( "\n" );

#if defined(MBEDTLS_CIPHER_MODE_CTR)
    /*
     * CTR mode
     */
    for( i = 0; i < 6; i++ )
    {
        u = i >> 1;
        v = i  & 1;

        if( verbose != 0 )
            mbedtls_printf( "  CAMELLIA-CTR-128 (%s): ",
                             ( v == MBEDTLS_CAMELLIA_DECRYPT ) ? "dec" : "enc" );

        memcpy( nonce_counter, camellia_test_ctr_nonce_counter[u], 16 );
        memcpy( key, camellia_test_ctr_key[u], 16 );

        offset = 0;
        mbedtls_camellia_setkey_enc( &ctx, key, 128 );

        if( v == MBEDTLS_CAMELLIA_DECRYPT )
        {
            len = camellia_test_ctr_len[u];
            memcpy( buf, camellia_test_ctr_ct[u], len );

            mbedtls_camellia_crypt_ctr( &ctx, len, &offset, nonce_counter, stream_block,
                                buf, buf );

            if( memcmp( buf, camellia_test_ctr_pt[u], len ) != 0 )
            {
                if( verbose != 0 )
                    mbedtls_printf( "failed\n" );

                return( 1 );
            }
        }
        else
        {
            len = camellia_test_ctr_len[u];
            memcpy( buf, camellia_test_ctr_pt[u], len );

            mbedtls_camellia_crypt_ctr( &ctx, len, &offset, nonce_counter, stream_block,
                                buf, buf );

            if( memcmp( buf, camellia_test_ctr_ct[u], len ) != 0 )
            {
                if( verbose != 0 )
                    mbedtls_printf( "failed\n" );

                return( 1 );
            }
        }

        if( verbose != 0 )
            mbedtls_printf( "passed\n" );
    }

    if( verbose != 0 )
        mbedtls_printf( "\n" );
#endif /* MBEDTLS_CIPHER_MODE_CTR */

    return( 0 );
}